

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

SyntaxList<slang::syntax::RsProdSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SyntaxList<slang::syntax::RsProdSyntax>,slang::syntax::SyntaxList<slang::syntax::RsProdSyntax>const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::RsProdSyntax> *args)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  SyntaxList<slang::syntax::RsProdSyntax> *pSVar4;
  
  pSVar4 = (SyntaxList<slang::syntax::RsProdSyntax> *)allocate(this,0x30,8);
  SVar2 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pSVar4->super_SyntaxListBase).super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pSVar4->super_SyntaxListBase).super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(pSVar4->super_SyntaxListBase).super_SyntaxNode.field_0xc = uVar3;
  (pSVar4->super_SyntaxListBase)._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0046ff68;
  (pSVar4->super_SyntaxListBase).childCount = (args->super_SyntaxListBase).childCount;
  sVar1 = (args->super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>).size_;
  (pSVar4->super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>).data_ =
       (args->super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>).data_;
  (pSVar4->super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>).size_ = sVar1;
  (pSVar4->super_SyntaxListBase)._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00473bf0;
  return pSVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }